

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

int __thiscall raspicam::_private::Private_Impl_Still::startCapture(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  uint uVar2;
  ostream *poVar3;
  MMAL_BUFFER_HEADER_T *buffer;
  uint uVar4;
  char *pcVar5;
  
  commitParameters(this);
  if (this->encoder_output_port->is_enabled == 0) {
    MVar1 = mmal_port_enable(this->encoder_output_port,buffer_callback);
    if (MVar1 == MMAL_SUCCESS) {
      uVar2 = mmal_queue_length(this->encoder_pool->queue);
      uVar4 = 0;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        buffer = mmal_queue_get(this->encoder_pool->queue);
        if (buffer == (MMAL_BUFFER_HEADER_T *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
          poVar3 = std::operator<<(poVar3,": Could not get buffer (#");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
          std::operator<<(poVar3,") from pool queue.\n");
        }
        MVar1 = mmal_port_send_buffer(this->encoder_output_port,buffer);
        if (MVar1 != MMAL_SUCCESS) {
          poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
          poVar3 = std::operator<<(poVar3,": Could not send a buffer (#");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
          std::operator<<(poVar3,") to encoder output port.\n");
        }
      }
      MVar1 = mmal_port_parameter_set_boolean(this->camera_still_port,0x10011,1);
      if (MVar1 == MMAL_SUCCESS) {
        return 0;
      }
      pcVar5 = ": Failed to start capture.\n";
    }
    else {
      pcVar5 = ": Could not enable encoder output port.\n";
    }
  }
  else {
    pcVar5 = 
    ": Could not enable encoder output port. Try waiting longer before attempting to take another picture.\n"
    ;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
  std::operator<<(poVar3,pcVar5);
  return -1;
}

Assistant:

int Private_Impl_Still::startCapture() {
            // If the parameters were changed and this function wasn't called, it will be called here
            // However if the parameters weren't changed, the function won't do anything - it will return right away
            commitParameters();

            if ( encoder_output_port->is_enabled ) {
                cout << API_NAME << ": Could not enable encoder output port. Try waiting longer before attempting to take another picture.\n";
                return -1;
            }
            if ( mmal_port_enable ( encoder_output_port, buffer_callback ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": Could not enable encoder output port.\n";
                return -1;
            }
            int num = mmal_queue_length ( encoder_pool->queue );
            for ( int b = 0; b < num; b++ ) {
                MMAL_BUFFER_HEADER_T *buffer = mmal_queue_get ( encoder_pool->queue );

                if ( !buffer )
                    cout << API_NAME << ": Could not get buffer (#" << b << ") from pool queue.\n";

                if ( mmal_port_send_buffer ( encoder_output_port, buffer ) != MMAL_SUCCESS )
                    cout << API_NAME << ": Could not send a buffer (#" << b << ") to encoder output port.\n";
            }
            if ( mmal_port_parameter_set_boolean ( camera_still_port, MMAL_PARAMETER_CAPTURE, 1 ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": Failed to start capture.\n";
                return -1;
            }
            return 0;
        }